

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginGroup(void)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiGroupData *__dest;
  uint uVar8;
  ImGuiContext *g;
  float fVar9;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  iVar3 = (pIVar5->DC).GroupStack.Size;
  iVar4 = (pIVar5->DC).GroupStack.Capacity;
  uVar2 = iVar3 + 1;
  if (iVar4 <= iVar3) {
    if (iVar4 == 0) {
      uVar8 = 8;
    }
    else {
      uVar8 = iVar4 / 2 + iVar4;
    }
    if ((int)uVar8 <= (int)uVar2) {
      uVar8 = uVar2;
    }
    if (iVar4 < (int)uVar8) {
      if (pIVar7 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar7->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiGroupData *)
               (*GImAllocatorAllocFunc)((long)(int)uVar8 * 0x2c,GImAllocatorUserData);
      pIVar6 = (pIVar5->DC).GroupStack.Data;
      if (pIVar6 != (ImGuiGroupData *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar5->DC).GroupStack.Size * 0x2c);
        pIVar6 = (pIVar5->DC).GroupStack.Data;
        if ((pIVar6 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      }
      (pIVar5->DC).GroupStack.Data = __dest;
      (pIVar5->DC).GroupStack.Capacity = uVar8;
    }
  }
  (pIVar5->DC).GroupStack.Size = uVar2;
  if (-1 < iVar3) {
    pIVar6 = (pIVar5->DC).GroupStack.Data;
    pIVar6[(ulong)uVar2 - 1].BackupCursorPos = (pIVar5->DC).CursorPos;
    pIVar6[(ulong)uVar2 - 1].BackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
    pIVar6[(ulong)uVar2 - 1].BackupIndent.x = (pIVar5->DC).Indent.x;
    pIVar6[(ulong)uVar2 - 1].BackupGroupOffset.x = (pIVar5->DC).GroupOffset.x;
    pIVar6[(ulong)uVar2 - 1].BackupCurrLineSize = (pIVar5->DC).CurrLineSize;
    pIVar6[(ulong)uVar2 - 1].BackupCurrLineTextBaseOffset = (pIVar5->DC).CurrLineTextBaseOffset;
    pIVar6[(ulong)uVar2 - 1].BackupActiveIdIsAlive = pIVar7->ActiveIdIsAlive;
    pIVar6[(ulong)uVar2 - 1].BackupActiveIdPreviousFrameIsAlive =
         pIVar7->ActiveIdPreviousFrameIsAlive;
    pIVar6[(ulong)uVar2 - 1].EmitItem = true;
    fVar9 = ((pIVar5->DC).CursorPos.x - (pIVar5->Pos).x) - (pIVar5->DC).ColumnsOffset.x;
    (pIVar5->DC).GroupOffset.x = fVar9;
    (pIVar5->DC).Indent.x = fVar9;
    (pIVar5->DC).CursorMaxPos = (pIVar5->DC).CursorPos;
    (pIVar5->DC).CurrLineSize.x = 0.0;
    (pIVar5->DC).CurrLineSize.y = 0.0;
    if (pIVar7->LogEnabled == true) {
      pIVar7->LogLinePosY = -3.4028235e+38;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                ,0x4f0,"T &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    window->DC.GroupStack.resize(window->DC.GroupStack.Size + 1);
    ImGuiGroupData& group_data = window->DC.GroupStack.back();
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return
}